

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O3

DS_STATUS ds_list_prepend(DsList *list,void *data)

{
  DsListEntry *pDVar1;
  DsListEntry *pDVar2;
  DS_STATUS DVar3;
  DsListEntry *pDVar4;
  DsList *pDVar5;
  DsList *pDVar6;
  
  if (list != (DsList *)0x0) {
    pDVar4 = (DsListEntry *)malloc(0x18);
    if (pDVar4 == (DsListEntry *)0x0) {
      DVar3 = DS_STATUS_OUTMEM;
    }
    else {
      pDVar4->data = data;
      pDVar4->next = (DsListEntry *)0x0;
      pDVar4->prev = (DsListEntry *)0x0;
      pDVar1 = list->entry;
      pDVar5 = list;
      if (pDVar1 != (DsListEntry *)0x0) {
        pDVar4->next = pDVar1;
        pDVar2 = pDVar1->prev;
        pDVar5 = (DsList *)&pDVar1->prev;
        pDVar4->prev = pDVar2;
        pDVar6 = (DsList *)&pDVar2->next;
        if (pDVar2 == (DsListEntry *)0x0) {
          pDVar6 = list;
        }
        pDVar6->entry = pDVar4;
      }
      pDVar5->entry = pDVar4;
      list->size = list->size + 1;
      DVar3 = DS_STATUS_OK;
    }
    return DVar3;
  }
  return DS_STATUS_NULL;
}

Assistant:

DS_STATUS ds_list_prepend(DsList *list, void *data)
{
    if (NULL == list)
        return DS_STATUS_NULL;
    DsListEntry *in = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == in)
        return DS_STATUS_OUTMEM;
    in->data = data;
    in->prev = NULL;
    in->next = NULL;

    DsListEntry **entry = &list->entry;
    if (DS_STATUS_OK != ds_entry_prepend(entry, in))
    {
        free(in);
        return DS_STATUS_NULL;
    }

    (list->size)++;
    return DS_STATUS_OK;
}